

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaValDecimalCompareWithInteger(xmlSchemaValDecimal *lhs,long rhs)

{
  int iVar1;
  undefined1 local_58 [8];
  xmlSchemaValDecimal tmpVal;
  char buf [43];
  long rhs_local;
  xmlSchemaValDecimal *lhs_local;
  
  iVar1 = snprintf((char *)&tmpVal.integralPlaces,0x2b,"%+ld.0",rhs);
  tmpVal.str._0_4_ = iVar1 + -3;
  local_58 = (undefined1  [8])&tmpVal.integralPlaces;
  tmpVal.str._4_4_ = 1;
  iVar1 = xmlSchemaValDecimalCompare(lhs,(xmlSchemaValDecimal *)local_58);
  return iVar1;
}

Assistant:

static int xmlSchemaValDecimalCompareWithInteger(const xmlSchemaValDecimal *lhs, long rhs)
{
    /* can handle integers up to 128 bits, should be good for a while */
    char buf[43];
    xmlSchemaValDecimal tmpVal;
    /* 3 = sign+dot+0+NULL */
    tmpVal.integralPlaces = snprintf(buf, sizeof(buf), "%+ld.0", rhs)-3;
    tmpVal.str = (xmlChar*)buf;
    tmpVal.fractionalPlaces = 1;
    return xmlSchemaValDecimalCompare(lhs, &tmpVal);
}